

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

ProValueMap * __thiscall
QMakeEvaluator::findValues(QMakeEvaluator *this,ProKey *variableName,Iterator *rit)

{
  ulong uVar1;
  bool bVar2;
  iterator iVar3;
  ulong uVar4;
  char16_t *pcVar5;
  _List_node_base *p_Var6;
  ulong uVar7;
  _List_node_base *this_00;
  
  p_Var6 = (this->m_valuemapStack).
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  this_00 = p_Var6 + 1;
  iVar3._M_node =
       (_Base_ptr)
       QMap<ProKey,_ProStringList>::find((QMap<ProKey,_ProStringList> *)this_00,variableName);
  QMap<ProKey,_ProStringList>::detach((QMap<ProKey,_ProStringList> *)this_00);
  if (iVar3._M_node == (_Base_ptr)(p_Var6[1]._M_next + 1)) {
    bVar2 = true;
    do {
      if (p_Var6 == (this->m_valuemapStack).
                    super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    .
                    super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next) goto LAB_00287e59;
      if (bVar2) {
        pcVar5 = (variableName->super_ProString).m_string.d.ptr;
        if (pcVar5 == (char16_t *)0x0) {
          pcVar5 = (char16_t *)&QString::_empty;
        }
        uVar4 = (ulong)(variableName->super_ProString).m_length;
        if ((long)uVar4 < 1) goto LAB_00287e59;
        if ((ushort)(pcVar5[(variableName->super_ProString).m_offset] + L'￐') < 10) {
          uVar1 = 1;
          do {
            uVar7 = uVar1;
            if (uVar4 == uVar7) break;
            uVar1 = uVar7 + 1;
          } while ((ushort)((pcVar5 + (variableName->super_ProString).m_offset)[uVar7] + L'￐') <
                   10);
          if (uVar4 <= uVar7) goto LAB_00287e59;
        }
      }
      p_Var6 = p_Var6->_M_prev;
      this_00 = p_Var6 + 1;
      iVar3._M_node =
           (_Base_ptr)
           QMap<ProKey,_ProStringList>::find((QMap<ProKey,_ProStringList> *)this_00,variableName);
      QMap<ProKey,_ProStringList>::detach((QMap<ProKey,_ProStringList> *)this_00);
      bVar2 = false;
    } while (iVar3._M_node == (_Base_ptr)(p_Var6[1]._M_next + 1));
  }
  if (iVar3._M_node[2]._M_right == (_Base_ptr)QMakeInternal::statics._608_8_) {
LAB_00287e59:
    this_00 = (_List_node_base *)0x0;
  }
  else {
    (rit->i)._M_node = iVar3._M_node;
  }
  return (ProValueMap *)this_00;
}

Assistant:

ProValueMap *QMakeEvaluator::findValues(const ProKey &variableName, ProValueMap::Iterator *rit)
{
    ProValueMapStack::iterator vmi = m_valuemapStack.end();
    for (bool first = true; ; first = false) {
        --vmi;
        ProValueMap::Iterator it = (*vmi).find(variableName);
        if (it != (*vmi).end()) {
            if (it->constBegin() == statics.fakeValue.constBegin())
                break;
            *rit = it;
            return &(*vmi);
        }
        if (vmi == m_valuemapStack.begin())
            break;
        if (first && isFunctParam(variableName))
            break;
    }
    return nullptr;
}